

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O1

void __thiscall QScrollBarPrivate::flash(QScrollBarPrivate *this)

{
  undefined8 uVar1;
  QWidget *this_00;
  int iVar2;
  QStyle *pQVar3;
  long lVar4;
  undefined8 *puVar5;
  QStyleOptionSlider *pQVar6;
  long in_FS_OFFSET;
  QStyleOptionSlider opt;
  QStyleOptionSlider local_a0;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8;
  puVar5 = &DAT_006eba80;
  pQVar6 = &local_a0;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    uVar1 = *puVar5;
    (pQVar6->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar1;
    (pQVar6->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar1 >> 0x20);
    puVar5 = puVar5 + 1;
    pQVar6 = (QStyleOptionSlider *)&(pQVar6->super_QStyleOptionComplex).super_QStyleOption.state;
  }
  QStyleOptionSlider::QStyleOptionSlider(&local_a0);
  (**(code **)(*(long *)this_00 + 0x1a8))(this_00,&local_a0);
  if (this->flashed == false) {
    pQVar3 = QWidget::style(this_00);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x60,&local_a0,this_00,0);
    if (iVar2 != 0) {
      this->flashed = true;
      if ((this_00->data->widget_attributes & 0x8000) == 0) {
        QWidget::show(this_00);
      }
      else {
        QWidget::update(this_00);
      }
    }
  }
  if ((this->flashTimer).m_id == Invalid) {
    QBasicTimer::start(&this->flashTimer,0,1,this_00);
  }
  QStyleOption::~QStyleOption((QStyleOption *)&local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollBarPrivate::flash()
{
    Q_Q(QScrollBar);
    QStyleOptionSlider opt;
    q->initStyleOption(&opt);
    if (!flashed && q->style()->styleHint(QStyle::SH_ScrollBar_Transient, &opt, q)) {
        flashed = true;
        if (!q->isVisible())
            q->show();
        else
            q->update();
    }
    if (!flashTimer.isActive())
        flashTimer.start(0ns, q);
}